

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void __thiscall AWeapon::CallEndPowerup(AWeapon *this)

{
  uint uVar1;
  MetaClass *pMVar2;
  VMFunction **ppVVar3;
  VMFrameStack *this_00;
  VMValue *local_68;
  VMFunction *local_60;
  undefined1 local_38 [8];
  VMValue params [1];
  VMFunction *func;
  MetaClass *clss;
  AWeapon *this_local;
  
  if ((CallEndPowerup::VIndex == 0xffffffff) &&
     (CallEndPowerup::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"EndPowerup"),
     CallEndPowerup::VIndex == 0xffffffff)) {
    __assert_fail("VIndex != ~0u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x33d,"void AWeapon::CallEndPowerup()");
  }
  pMVar2 = GetClass(this);
  uVar1 = TArray<VMFunction_*,_VMFunction_*>::Size
                    (&(pMVar2->super_PClassInventory).super_PClassActor.super_PClass.Virtuals);
  if (CallEndPowerup::VIndex < uVar1) {
    ppVVar3 = TArray<VMFunction_*,_VMFunction_*>::operator[]
                        (&(pMVar2->super_PClassInventory).super_PClassActor.super_PClass.Virtuals,
                         (ulong)CallEndPowerup::VIndex);
    local_60 = *ppVVar3;
  }
  else {
    local_60 = (VMFunction *)0x0;
  }
  if (local_60 == (VMFunction *)0x0) {
    (*(this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
      _vptr_DObject[0x31])();
  }
  else {
    VMValue::VMValue((VMValue *)local_38,(DObject *)this);
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,local_60,(VMValue *)local_38,1,(VMReturn *)0x0,0,(VMException **)0x0)
    ;
    local_68 = (VMValue *)((long)&params[0].field_0 + 8);
    do {
      local_68 = local_68 + -1;
      VMValue::~VMValue(local_68);
    } while (local_68 != (VMValue *)local_38);
  }
  return;
}

Assistant:

void AWeapon::CallEndPowerup()
{
	IFVIRTUAL(AWeapon, EndPowerup)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[1] = { (DObject*)this };
		GlobalVMStack.Call(func, params, 1, nullptr, 0, nullptr);
	}
	else EndPowerup();
}